

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall Assimp::STEP::DB::SetTypesToTrack(DB *this,char **types,size_t N)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<const_Assimp::STEP::LazyObject_*,_const_Assimp::STEP::LazyObject_*,_std::_Identity<const_Assimp::STEP::LazyObject_*>,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
  *this_00;
  size_t sVar2;
  allocator<char> local_89;
  _Rb_tree<const_Assimp::STEP::LazyObject_*,_const_Assimp::STEP::LazyObject_*,_std::_Identity<const_Assimp::STEP::LazyObject_*>,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
  local_88;
  char **local_58;
  key_type local_50;
  
  if (N != 0) {
    p_Var1 = &local_88._M_impl.super__Rb_tree_header;
    sVar2 = 0;
    local_58 = types;
    do {
      local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88._M_impl._0_8_ = 0;
      local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,local_58[sVar2],&local_89);
      this_00 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                 ::operator[](&this->objects_bytype,&local_50)->_M_t;
      std::
      _Rb_tree<const_Assimp::STEP::LazyObject_*,_const_Assimp::STEP::LazyObject_*,_std::_Identity<const_Assimp::STEP::LazyObject_*>,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
      ::clear(this_00);
      if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (this_00->_M_impl).super__Rb_tree_header._M_header._M_color =
             local_88._M_impl.super__Rb_tree_header._M_header._M_color;
        (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent =
             local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
        (this_00->_M_impl).super__Rb_tree_header._M_header._M_left =
             local_88._M_impl.super__Rb_tree_header._M_header._M_left;
        (this_00->_M_impl).super__Rb_tree_header._M_header._M_right =
             local_88._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_88._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &(this_00->_M_impl).super__Rb_tree_header._M_header;
        (this_00->_M_impl).super__Rb_tree_header._M_node_count =
             local_88._M_impl.super__Rb_tree_header._M_node_count;
        local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<const_Assimp::STEP::LazyObject_*,_const_Assimp::STEP::LazyObject_*,_std::_Identity<const_Assimp::STEP::LazyObject_*>,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
      ::~_Rb_tree(&local_88);
      sVar2 = sVar2 + 1;
    } while (N != sVar2);
  }
  return;
}

Assistant:

void SetTypesToTrack(const char* const* types, size_t N) {
            for(size_t i = 0; i < N;++i) {
                objects_bytype[types[i]] = ObjectSet();
            }
        }